

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

shared_ptr<wallet::CWallet> __thiscall
wallet::LoadWallet(wallet *this,WalletContext *context,string *name,optional<bool> load_on_start,
                  DatabaseOptions *options,DatabaseStatus *status,bilingual_str *error,
                  vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  _Head_base<0UL,_wallet::WalletDatabase_*,_false> _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Chain *pCVar4;
  pointer pcVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  shared_ptr<wallet::CWallet> sVar11;
  shared_ptr<wallet::CWallet> wallet;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database;
  size_type __dnew;
  long *local_1c0;
  undefined1 local_1b8 [24];
  long *local_1a0;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  *local_198;
  long local_190;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  local_188 [2];
  undefined2 *local_178;
  time_point local_170;
  undefined2 local_168;
  undefined6 uStack_166;
  __atomic_base<long> local_158;
  size_type local_150;
  uint64_t local_148 [2];
  size_type *local_138;
  __node_base local_130;
  size_type local_128 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Base_ptr local_38;
  
  local_38 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  local_78._0_8_ = g_loading_wallet_mutex;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_78);
  pVar10 = std::
           _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
           ::_M_insert_unique<std::__cxx11::string_const&>
                     ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)g_loading_wallet_set_abi_cxx11_,name);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_78);
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_198 = local_188;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_198,"Wallet already loading.","");
    local_78._0_8_ = (mutex_type *)(local_78 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_198,(long)&(local_198->_M_i).__d.__r + local_190);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_198,(long)&(local_198->_M_i).__d.__r + local_190);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,&local_58);
    _Var9._M_pi = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,(ulong)(local_58.field_2._M_allocated_capacity + 1))
      ;
      _Var9._M_pi = extraout_RDX_01;
    }
    if ((mutex_type *)local_78._0_8_ != (mutex_type *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
      _Var9._M_pi = extraout_RDX_02;
    }
    if (local_198 != local_188) {
      operator_delete(local_198,(long)local_188[0]._M_i.__d.__r + 1);
      _Var9._M_pi = extraout_RDX_03;
    }
    *status = FAILED_LOAD;
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    MakeWalletDatabase((wallet *)&local_1a0,name,options,status,error);
    if (local_1a0 == (long *)0x0) {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      local_b8._M_dataplus._M_p = (pointer)0x20;
      local_118._M_dataplus._M_p =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create(&local_118,(size_type *)&local_b8,0);
      local_118.field_2._M_allocated_capacity = (size_type)local_b8._M_dataplus._M_p;
      builtin_strncpy(local_118._M_dataplus._M_p,"Wallet file verification failed.",0x20);
      local_118._M_string_length = (size_type)local_b8._M_dataplus._M_p;
      local_118._M_dataplus._M_p[local_b8._M_dataplus._M_p] = '\0';
      paVar8 = &local_f8.field_2;
      local_f8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_b8._M_dataplus._M_p);
      _Var1._M_head_impl = (WalletDatabase *)(local_d8 + 0x10);
      local_d8._0_8_ = _Var1._M_head_impl;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d8,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + (long)(_Hash_node_base **)local_118._M_string_length);
      local_178 = &local_168;
      local_168._0_1_ = true;
      local_168._1_1_ = 0;
      local_170.__d.__r = (duration)1;
      local_158._M_i = (__int_type_conflict2)local_148;
      std::__cxx11::string::_M_construct<char*>((string *)&local_158,local_178,(long)&local_168 + 1)
      ;
      local_138 = local_128;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_178,(long)local_170.__d.__r + (long)local_178);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_f8,(char *)local_158._M_i,local_150);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 (char *)local_138,(size_type)local_130._M_nxt);
      paVar2 = &local_b8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == paVar8) {
        local_b8.field_2._8_8_ = local_f8.field_2._8_8_;
        local_b8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_b8._M_dataplus._M_p = local_f8._M_dataplus._M_p;
      }
      local_b8.field_2._M_allocated_capacity._1_7_ = local_f8.field_2._M_allocated_capacity._1_7_;
      local_b8.field_2._M_local_buf[0] = local_f8.field_2._M_local_buf[0];
      local_98._0_8_ = local_98 + 0x10;
      local_b8._M_string_length = local_f8._M_string_length;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      if ((WalletDatabase *)local_d8._0_8_ == _Var1._M_head_impl) {
        local_98._24_8_ = local_d8._24_8_;
      }
      else {
        local_98._0_8_ = local_d8._0_8_;
      }
      local_98._17_7_ = local_d8._17_7_;
      local_98[0x10] = local_d8[0x10];
      local_98._8_8_ = local_d8._8_8_;
      local_d8._8_8_ = (_Base_ptr)0x0;
      local_d8[0x10] = '\0';
      local_f8._M_dataplus._M_p = (pointer)paVar8;
      local_d8._0_8_ = _Var1._M_head_impl;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_b8,(error->original)._M_dataplus._M_p,(error->original)._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 (error->translated)._M_dataplus._M_p,(error->translated)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == paVar2) {
        local_78._24_8_ = local_b8.field_2._8_8_;
        local_78._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_78 + 0x10);
      }
      else {
        local_78._0_8_ = local_b8._M_dataplus._M_p;
      }
      local_78._16_8_ = local_b8.field_2._M_allocated_capacity;
      local_78._8_8_ = local_b8._M_string_length;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity =
           local_b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if ((WalletDatabase *)local_98._0_8_ == (WalletDatabase *)(local_98 + 0x10)) {
        local_58.field_2._8_8_ = local_98._24_8_;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      else {
        local_58._M_dataplus._M_p = (pointer)local_98._0_8_;
      }
      local_58.field_2._M_allocated_capacity = local_98._16_8_;
      local_58._M_string_length = local_98._8_8_;
      local_98._8_8_ = (_Base_ptr)0x0;
      local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      local_98._0_8_ = (WalletDatabase *)(local_98 + 0x10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        (ulong)(local_58.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
      }
      if ((WalletDatabase *)local_98._0_8_ != (WalletDatabase *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_138 != local_128) {
        operator_delete(local_138,local_128[0] + 1);
      }
      if ((uint64_t *)local_158._M_i != local_148) {
        operator_delete((void *)local_158._M_i,local_148[0] + 1);
      }
      if (local_178 != &local_168) {
        operator_delete(local_178,CONCAT62(uStack_166,local_168) + 1);
      }
      if ((WalletDatabase *)local_d8._0_8_ != (WalletDatabase *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,
                        (ulong)(local_118.field_2._M_allocated_capacity + 1));
      }
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
    }
    else {
      pCVar4 = context->chain;
      local_78._0_8_ = local_78 + 0x10;
      local_b8._M_dataplus._M_p = (pointer)0x11;
      local_78._0_8_ =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     (size_type *)&local_b8,0);
      local_78._16_8_ = local_b8._M_dataplus._M_p;
      *(undefined8 *)local_78._0_8_ = 0x20676e6964616f4c;
      pcVar5 = (pointer)(local_78._0_8_ + 8);
      pcVar5[0] = 'w';
      pcVar5[1] = 'a';
      pcVar5[2] = 'l';
      pcVar5[3] = 'l';
      pcVar5[4] = 'e';
      pcVar5[5] = 't';
      pcVar5[6] = -0x1e;
      pcVar5[7] = -0x80;
      *(char *)(local_78._0_8_ + 0x10) = -0x5a;
      local_78._8_8_ = local_b8._M_dataplus._M_p;
      local_b8._M_dataplus._M_p[local_78._0_8_] = '\0';
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_b8._M_dataplus._M_p = (pointer)0x11;
        local_58._M_dataplus._M_p =
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_create(&local_58,(size_type *)&local_b8,0);
        local_58.field_2._M_allocated_capacity = (size_type)local_b8._M_dataplus._M_p;
        *(undefined4 *)local_58._M_dataplus._M_p = 0x64616f4c;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p + 4) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p + 5) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p + 6) = 'g';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p + 7) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p + 8) = 'w';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p + 9) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p + 10) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p + 0xb) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p + 0xc) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p + 0xd) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p + 0xe) = -0x1e;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p + 0xf) = -0x80;
        local_58._M_dataplus._M_p[0x10] = -0x5a;
        local_58._M_string_length = (size_type)local_b8._M_dataplus._M_p;
        local_58._M_dataplus._M_p[local_b8._M_dataplus._M_p] = '\0';
      }
      else {
        local_b8._M_dataplus._M_p = anon_var_dwarf_1971f13;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_58,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_b8);
      }
      (*pCVar4->_vptr_Chain[0x25])(pCVar4,&local_58);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_78 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        (ulong)(local_58.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != paVar8) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
      }
      local_1c0 = local_1a0;
      local_1a0 = (long *)0x0;
      CWallet::Create((CWallet *)local_1b8,context,name,
                      (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       )&local_1c0,options->create_flags,error,warnings);
      if (local_1c0 != (long *)0x0) {
        (**(code **)(*local_1c0 + 8))();
      }
      local_1c0 = (long *)0x0;
      if ((CWallet *)local_1b8._0_8_ == (CWallet *)0x0) {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        local_b8._M_dataplus._M_p = (pointer)0x16;
        local_118._M_dataplus._M_p =
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_create(&local_118,(size_type *)&local_b8,0);
        local_118.field_2._M_allocated_capacity = (size_type)local_b8._M_dataplus._M_p;
        builtin_strncpy(local_118._M_dataplus._M_p,"Wallet loading failed.",0x16);
        local_118._M_string_length = (size_type)local_b8._M_dataplus._M_p;
        local_118._M_dataplus._M_p[local_b8._M_dataplus._M_p] = '\0';
        paVar2 = &local_f8.field_2;
        local_f8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_118._M_dataplus._M_p,
                   local_118._M_dataplus._M_p + local_b8._M_dataplus._M_p);
        local_d8._0_8_ = (long)local_d8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d8,local_118._M_dataplus._M_p,
                   local_118._M_dataplus._M_p + (long)(_Hash_node_base **)local_118._M_string_length
                  );
        local_178 = &local_168;
        local_168._0_1_ = true;
        local_168._1_1_ = 0;
        local_170.__d.__r = (duration)1;
        local_158._M_i = (__int_type_conflict2)local_148;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,local_178,(long)&local_168 + 1);
        local_138 = local_128;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,local_178,(long)local_170.__d.__r + (long)local_178);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_f8,(char *)local_158._M_i,local_150);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   (char *)local_138,(size_type)local_130._M_nxt);
        paVar3 = &local_b8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p == paVar2) {
          local_b8.field_2._8_8_ = local_f8.field_2._8_8_;
          local_b8._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_b8._M_dataplus._M_p = local_f8._M_dataplus._M_p;
        }
        local_b8.field_2._M_allocated_capacity._1_7_ = local_f8.field_2._M_allocated_capacity._1_7_;
        local_b8.field_2._M_local_buf[0] = local_f8.field_2._M_local_buf[0];
        local_98._0_8_ = local_98 + 0x10;
        local_b8._M_string_length = local_f8._M_string_length;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_local_buf[0] = '\0';
        if ((WalletDatabase *)local_d8._0_8_ == (WalletDatabase *)(local_d8 + 0x10)) {
          local_98._24_8_ = local_d8._24_8_;
        }
        else {
          local_98._0_8_ = local_d8._0_8_;
        }
        local_98._17_7_ = local_d8._17_7_;
        local_98[0x10] = local_d8[0x10];
        local_98._8_8_ = local_d8._8_8_;
        local_d8._8_8_ = (_Base_ptr)0x0;
        local_d8[0x10] = '\0';
        local_f8._M_dataplus._M_p = (pointer)paVar2;
        local_d8._0_8_ = (WalletDatabase *)(local_d8 + 0x10);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_b8,(error->original)._M_dataplus._M_p,(error->original)._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   (error->translated)._M_dataplus._M_p,(error->translated)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == paVar3) {
          local_78._24_8_ = local_b8.field_2._8_8_;
          local_78._0_8_ = paVar8;
        }
        else {
          local_78._0_8_ = local_b8._M_dataplus._M_p;
        }
        local_78._16_8_ = local_b8.field_2._M_allocated_capacity;
        local_78._8_8_ = local_b8._M_string_length;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_allocated_capacity =
             local_b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if ((WalletDatabase *)local_98._0_8_ == (WalletDatabase *)(local_98 + 0x10)) {
          local_58.field_2._8_8_ = local_98._24_8_;
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58._M_dataplus._M_p = (pointer)local_98._0_8_;
        }
        local_58.field_2._M_allocated_capacity = local_98._16_8_;
        local_58._M_string_length = local_98._8_8_;
        local_98._8_8_ = (_Base_ptr)0x0;
        local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
        local_b8._M_dataplus._M_p = (pointer)paVar3;
        local_98._0_8_ = (WalletDatabase *)(local_98 + 0x10);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->original,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->translated,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          (ulong)(local_58.field_2._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
          operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
        }
        if ((WalletDatabase *)local_98._0_8_ != (WalletDatabase *)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar3) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_138 != local_128) {
          operator_delete(local_138,local_128[0] + 1);
        }
        if ((uint64_t *)local_158._M_i != local_148) {
          operator_delete((void *)local_158._M_i,local_148[0] + 1);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,CONCAT62(uStack_166,local_168) + 1);
        }
        if ((WalletDatabase *)local_d8._0_8_ != (WalletDatabase *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                   local_f8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          (ulong)(local_118.field_2._M_allocated_capacity + 1));
        }
        *status = FAILED_LOAD;
        *(undefined8 *)this = 0;
        *(undefined8 *)(this + 8) = 0;
      }
      else {
        if (((((atomic<unsigned_long> *)(local_1b8._0_8_ + 0xb0))->
             super___atomic_base<unsigned_long>)._M_i >> 0x22 & 1) == 0) {
          local_b8._M_dataplus._M_p = (pointer)0xe3;
          local_78._0_8_ = paVar8;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_78,(size_type *)&local_b8,0);
          _Var7._M_p = local_b8._M_dataplus._M_p;
          local_78._16_8_ = local_b8._M_dataplus._M_p;
          local_78._0_8_ = paVar8;
          memcpy(paVar8,
                 "Wallet loaded successfully. The legacy wallet type is being deprecated and support for creating and opening legacy wallets will be removed in the future. Legacy wallets can be migrated to a descriptor wallet with migratewallet."
                 ,0xe3);
          local_78._8_8_ = _Var7._M_p;
          _Var7._M_p[(long)paVar8] = '\0';
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            local_b8._M_dataplus._M_p = (pointer)0xe3;
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                                  (&local_58,(size_type *)&local_b8,0);
            _Var7._M_p = local_b8._M_dataplus._M_p;
            local_58.field_2._M_allocated_capacity = (size_type)local_b8._M_dataplus._M_p;
            local_58._M_dataplus._M_p = (pointer)paVar8;
            memcpy(paVar8,
                   "Wallet loaded successfully. The legacy wallet type is being deprecated and support for creating and opening legacy wallets will be removed in the future. Legacy wallets can be migrated to a descriptor wallet with migratewallet."
                   ,0xe3);
            local_58._M_string_length = (size_type)_Var7._M_p;
            paVar8->_M_local_buf[_Var7._M_p] = '\0';
          }
          else {
            local_b8._M_dataplus._M_p =
                 "Wallet loaded successfully. The legacy wallet type is being deprecated and support for creating and opening legacy wallets will be removed in the future. Legacy wallets can be migrated to a descriptor wallet with migratewallet."
            ;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_58,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_b8);
          }
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (warnings,(bilingual_str *)local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            (ulong)(local_58.field_2._M_allocated_capacity + 1));
          }
          if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
            operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
          }
        }
        NotifyWalletLoaded(context,(shared_ptr<wallet::CWallet> *)local_1b8);
        AddWallet(context,(shared_ptr<wallet::CWallet> *)local_1b8);
        CWallet::postInitProcess((CWallet *)local_1b8._0_8_);
        UpdateWalletSetting(context->chain,name,load_on_start,warnings);
        uVar6 = local_1b8._8_8_;
        *(undefined8 *)(this + 8) = 0;
        local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(undefined8 *)this = local_1b8._0_8_;
        *(undefined8 *)(this + 8) = uVar6;
        local_1b8._0_8_ = (CWallet *)0x0;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
      }
    }
    if (local_1a0 != (long *)0x0) {
      (**(code **)(*local_1a0 + 8))();
    }
    local_78._0_8_ = g_loading_wallet_mutex;
    local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_78);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)g_loading_wallet_set_abi_cxx11_,(_Base_ptr)pVar10.first._M_node);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_78);
    _Var9._M_pi = extraout_RDX;
  }
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_38) {
    sVar11.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var9._M_pi;
    sVar11.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<wallet::CWallet>)
           sVar11.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> LoadWallet(WalletContext& context, const std::string& name, std::optional<bool> load_on_start, const DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    auto result = WITH_LOCK(g_loading_wallet_mutex, return g_loading_wallet_set.insert(name));
    if (!result.second) {
        error = Untranslated("Wallet already loading.");
        status = DatabaseStatus::FAILED_LOAD;
        return nullptr;
    }
    auto wallet = LoadWalletInternal(context, name, load_on_start, options, status, error, warnings);
    WITH_LOCK(g_loading_wallet_mutex, g_loading_wallet_set.erase(result.first));
    return wallet;
}